

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::image::anon_unknown_0::StoreTestInstance::verifyResult
          (TestStatus *__return_storage_ptr__,StoreTestInstance *this)

{
  VkFormat VVar1;
  long lVar2;
  TestLog *log;
  bool bVar3;
  DeviceInterface *vkd;
  VkDevice device;
  IVec3 imageSize;
  TextureLevel reference;
  ConstPixelBufferAccess result;
  allocator<char> local_101;
  string local_100;
  undefined1 local_dc [52];
  ConstPixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  vkd = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  Texture::size((Texture *)local_dc);
  VVar1 = (this->super_BaseTestInstance).m_format;
  generateReferenceImage((TextureLevel *)(local_dc + 0xc),(IVec3 *)local_dc,VVar1,VVar1);
  lVar2 = (long)(((this->m_imageBuffer).
                  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                  m_data.ptr)->m_allocation).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)*(deUint64 *)(lVar2 + 8),*(VkDeviceSize *)(lVar2 + 0x10),
             this->m_imageSizeBytes);
  local_100._M_dataplus._M_p = (pointer)::vk::mapVkFormat((this->super_BaseTestInstance).m_format);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_58,(TextureFormat *)&local_100,(IVec3 *)local_dc,*(void **)(lVar2 + 0x18));
  log = ((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  VVar1 = (this->super_BaseTestInstance).m_format;
  tcu::TextureLevel::getAccess(&local_80,(TextureLevel *)(local_dc + 0xc));
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_a8,&local_58);
  bVar3 = comparePixelBuffers(log,&(this->super_BaseTestInstance).m_texture,VVar1,&local_80,
                              &local_a8);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Passed",&local_101);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_100);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Image comparison failed",&local_101);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_100);
  }
  std::__cxx11::string::~string((string *)&local_100);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)(local_dc + 0xc));
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus StoreTestInstance::verifyResult	(void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const tcu::IVec3 imageSize = m_texture.size();
	const tcu::TextureLevel reference = generateReferenceImage(imageSize, m_format);

	const Allocation& alloc = m_imageBuffer->getAllocation();
	invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_imageSizeBytes);
	const tcu::ConstPixelBufferAccess result(mapVkFormat(m_format), imageSize, alloc.getHostPtr());

	if (comparePixelBuffers(m_context.getTestContext().getLog(), m_texture, m_format, reference.getAccess(), result))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}